

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>::SmallVector
          (SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *this,
          SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *RHS)

{
  (this->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
  super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.BeginX =
       &this->super_SmallVectorStorage<llvm::DWARFDebugMacro::Entry,_4U>;
  (this->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
  super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.Size = 0
  ;
  (this->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
  super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.Capacity
       = 4;
  if ((RHS->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
      super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
      super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.Size
      != 0) {
    SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::operator=
              (&this->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>,
               &RHS->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>);
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }